

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::handleMessage
          (RpcConnectionState *this,Own<capnp::IncomingRpcMessage> *message)

{
  uint *puVar1;
  short sVar2;
  undefined8 *puVar3;
  PromiseFulfiller<kj::Own<capnp::ClientHook>_> *pPVar4;
  Embargo *pEVar5;
  PromiseFulfiller<void> *pPVar6;
  PromiseFulfiller<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>
  *pPVar7;
  IncomingRpcMessage *pIVar8;
  Builder builder;
  Reader descriptor;
  Reader capTable;
  Reader capTable_00;
  Disposer *pDVar9;
  ClientHook *pCVar10;
  Refcounted *pRVar11;
  CapTableReader *pCVar12;
  int iVar13;
  undefined4 uVar14;
  Answer *pAVar15;
  Maybe<capnp::_::(anonymous_namespace)::RpcConnectionState::Question_&> this_00;
  Maybe<capnp::_::(anonymous_namespace)::RpcConnectionState::Answer_&> MVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TransformPromiseNodeBase *pTVar18;
  Maybe<capnp::_::(anonymous_namespace)::RpcConnectionState::Import_&> MVar19;
  RpcCallContext *pRVar20;
  ForkHub<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> *pFVar21;
  Refcounted *refcounted_1;
  uint *entry;
  WirePointer *pWVar22;
  uint refcount;
  ulong uVar23;
  ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer> *this_01;
  uint64_t uVar24;
  uint uVar25;
  ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer> *this_02;
  Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *this_03;
  VoidPromiseAndPipeline *this_04;
  PromiseFulfillerPair<void> *this_05;
  uint16_t uVar26;
  uint64_t methodId;
  Refcounted *refcounted_2;
  bool bVar27;
  MessageSizeCounts MVar28;
  Fault f_3;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext> OStack_500;
  Array<unsigned_int> exportsToRelease;
  OwnOwn<capnp::ClientHook> cap_1;
  undefined1 local_4b8 [48];
  Own<capnp::ClientHook> capHook;
  undefined1 local_470;
  ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> forked;
  PromiseForResult<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_c__:2346:36),_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>_>,_void>
  resultsPromise;
  Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> capTableArray;
  PromiseFulfillerPair<void> cancelPaf;
  VoidPromiseAndPipeline promiseAndPipeline;
  undefined4 local_3d8;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext> context;
  Own<capnp::ClientHook> capability;
  undefined1 local_3a8 [32];
  Own<kj::_::PromiseNode> local_388;
  uint local_378;
  undefined4 uStack_374;
  undefined8 uStack_370;
  Refcounted *refcounted;
  undefined8 local_358;
  undefined8 uStack_350;
  ReaderFor<capnp::rpc::Message> reader;
  Reader resolve;
  Own<kj::_::PromiseNode> local_1a8;
  Reader cap;
  long *plVar17;
  
  (**message->ptr->_vptr_IncomingRpcMessage)(&resolve);
  AnyPointer::Reader::getAs<capnp::rpc::Message>(&reader,(Reader *)&resolve);
  if (0xf < reader._reader.dataSize) {
    entry = &switchD_003f4e9c::switchdataD_00546880;
    switch(*reader._reader.data) {
    case 0:
      goto switchD_003f4e9c_caseD_0;
    case 1:
      rpc::Message::Reader::getAbort((Reader *)&cap,&reader);
      toException((Exception *)&resolve,(Reader *)&cap);
      kj::throwRecoverableException((Exception *)&resolve,0);
      kj::Exception::~Exception((Exception *)&resolve);
      return;
    case 2:
      rpc::Message::Reader::getCall((Reader *)&cap_1,&reader);
      capability.disposer = (Disposer *)0x0;
      capability.ptr = (ClientHook *)0x0;
      rpc::Call::Reader::getTarget((Reader *)&resolve,(Reader *)&cap_1);
      getMessageTarget((RpcConnectionState *)&promiseAndPipeline,(Reader *)this);
      cap._reader.segment =
           (SegmentReader *)promiseAndPipeline.promise.super_PromiseBase.node.disposer;
      cap._reader.capTable = (CapTableReader *)promiseAndPipeline.promise.super_PromiseBase.node.ptr
      ;
      promiseAndPipeline.promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&promiseAndPipeline);
      pCVar12 = cap._reader.capTable;
      if (cap._reader.capTable != (CapTableReader *)0x0) {
        kj::Own<capnp::ClientHook>::operator=(&capability,(Own<capnp::ClientHook> *)&cap);
      }
      kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&cap);
      if (pCVar12 != (CapTableReader *)0x0) {
        if (((uint)local_4b8._16_4_ < 0x40) || (*(short *)(local_4b8._0_8_ + 6) == 0)) {
          local_470 = false;
        }
        else {
          if (*(short *)(local_4b8._0_8_ + 6) != 1) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                      ((Fault *)&resolve,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0x902,FAILED,(char *)0x0,"\"Unsupported `Call.sendResultsTo`.\"",
                       (char (*) [34])"Unsupported `Call.sendResultsTo`.");
            kj::_::Debug::Fault::~Fault((Fault *)&resolve);
            goto LAB_003f67d7;
          }
          local_470 = true;
        }
        rpc::Call::Reader::getParams((Reader *)&resolve,(Reader *)&cap_1);
        rpc::Payload::Reader::getCapTable((Reader *)&cap,(Reader *)&resolve);
        capTable.reader.capTable = cap._reader.capTable;
        capTable.reader.segment = cap._reader.segment;
        capTable.reader.ptr = (byte *)cap._reader.data;
        capTable.reader._24_8_ = cap._reader.pointers;
        capTable.reader.structDataSize = cap._reader.dataSize;
        capTable.reader.structPointerCount = cap._reader.pointerCount;
        capTable.reader.elementSize = cap._reader._38_1_;
        capTable.reader._39_1_ = cap._reader._39_1_;
        capTable.reader.nestingLimit = cap._reader.nestingLimit;
        capTable.reader._44_4_ = cap._reader._44_4_;
        receiveCaps(&capTableArray,this,capTable);
        kj::newPromiseAndFulfiller<void>();
        local_378 = 0;
        if (0x1f < (uint)local_4b8._16_4_) {
          local_378 = *(uint *)local_4b8._0_8_;
        }
        bVar27 = resolve._reader.pointerCount != 0;
        pWVar22 = (WirePointer *)0x0;
        if (bVar27) {
          pWVar22 = resolve._reader.pointers;
        }
        iVar13 = 0x7fffffff;
        if (bVar27) {
          iVar13 = resolve._reader.nestingLimit;
        }
        local_358 = (SegmentReader *)0x0;
        uStack_350 = (CapTableReader *)0x0;
        if (bVar27) {
          local_358 = resolve._reader.segment;
          uStack_350 = resolve._reader.capTable;
        }
        if ((uint)local_4b8._16_4_ < 0x80) {
          if (0x2f < (uint)local_4b8._16_4_) {
            uVar24 = 0;
            goto LAB_003f6045;
          }
          uVar24 = 0;
          uVar26 = 0;
        }
        else {
          uVar24 = *(uint64_t *)(local_4b8._0_8_ + 8);
LAB_003f6045:
          uVar26 = *(uint16_t *)(local_4b8._0_8_ + 4);
        }
        pRVar20 = (RpcCallContext *)operator_new(0x108);
        exportsToRelease.ptr = (uint *)capTableArray.ptr;
        exportsToRelease.disposer =
             (ArrayDisposer *)CONCAT71(capTableArray.disposer._1_7_,capTableArray.disposer._0_1_);
        exportsToRelease.size_ = capTableArray.size_;
        capTableArray.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
        capTableArray.size_ = 0;
        (pRVar20->super_Refcounted).refcount = 0;
        refcounted = &pRVar20->super_Refcounted;
        (pRVar20->super_CallContextHook)._vptr_CallContextHook =
             (_func_int **)&PTR_getParams_006700b8;
        (pRVar20->super_Refcounted).super_Disposer._vptr_Disposer =
             (_func_int **)&PTR_disposeImpl_00670118;
        puVar1 = &(this->super_Refcounted).refcount;
        *puVar1 = *puVar1 + 1;
        (pRVar20->connectionState).disposer = &(this->super_Refcounted).super_Disposer;
        (pRVar20->connectionState).ptr = this;
        pRVar20->answerId = local_378;
        pRVar20->interfaceId = uVar24;
        pRVar20->methodId = uVar26;
        (**message->ptr->_vptr_IncomingRpcMessage)(&promiseAndPipeline);
        MVar28 = PointerReader::targetSize((PointerReader *)&promiseAndPipeline);
        pRVar20->requestSize = MVar28.wordCount;
        pIVar8 = message->ptr;
        (pRVar20->request).ptr.disposer = message->disposer;
        (pRVar20->request).ptr.ptr = pIVar8;
        message->ptr = (IncomingRpcMessage *)0x0;
        f_3.exception = (Exception *)exportsToRelease.ptr;
        OStack_500.disposer = (Disposer *)exportsToRelease.size_;
        OStack_500.ptr = (RpcCallContext *)exportsToRelease.disposer;
        exportsToRelease.ptr = (uint *)0x0;
        exportsToRelease.size_ = 0;
        ReaderCapabilityTable::ReaderCapabilityTable
                  (&pRVar20->paramsCapTable,(Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)&f_3);
        kj::Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::~Array
                  ((Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)&f_3);
        pRVar11 = refcounted;
        promiseAndPipeline.promise.super_PromiseBase.node.disposer = (Disposer *)local_358;
        promiseAndPipeline.promise.super_PromiseBase.node.ptr = (PromiseNode *)uStack_350;
        promiseAndPipeline.pipeline.ptr =
             (PipelineHook *)CONCAT44(promiseAndPipeline.pipeline.ptr._4_4_,iVar13);
        promiseAndPipeline.pipeline.disposer = (Disposer *)pWVar22;
        PointerReader::imbue
                  (&(pRVar20->params).reader,(PointerReader *)&promiseAndPipeline,
                   &(pRVar20->paramsCapTable).super_CapTableReader);
        local_358 = &pRVar20->response;
        (pRVar20->returnMessage)._builder.data = (void *)0x0;
        (pRVar20->returnMessage)._builder.pointers = (WirePointer *)0x0;
        (pRVar20->returnMessage)._builder.segment = (SegmentBuilder *)0x0;
        (pRVar20->returnMessage)._builder.capTable = (CapTableBuilder *)0x0;
        (pRVar20->response).ptr.disposer = (Disposer *)0x0;
        (pRVar20->response).ptr.ptr = (RpcServerResponse *)0x0;
        pRVar20->redirectResults = (bool)local_470;
        pRVar20->responseSent = false;
        (pRVar20->tailCallPipelineFulfiller).ptr.disposer = (Disposer *)0x0;
        (pRVar20->tailCallPipelineFulfiller).ptr.ptr =
             (PromiseFulfiller<capnp::AnyPointer::Pipeline> *)0x0;
        pRVar20->cancellationFlags = '\0';
        (pRVar20->cancelFulfiller).disposer = cancelPaf.fulfiller.disposer;
        (pRVar20->cancelFulfiller).ptr = cancelPaf.fulfiller.ptr;
        cancelPaf.fulfiller.ptr = (PromiseFulfiller<void> *)0x0;
        kj::UnwindDetector::UnwindDetector(&pRVar20->unwindDetector);
        this->callWordsInFlight = this->callWordsInFlight + pRVar20->requestSize;
        puVar1 = &(pRVar20->super_Refcounted).refcount;
        *puVar1 = *puVar1 + 1;
        context.disposer = &pRVar11->super_Disposer;
        context.ptr = pRVar20;
        kj::Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::~Array
                  ((Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)&exportsToRelease);
        pAVar15 = ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>
                  ::operator[](&this->answers,local_378);
        if (pAVar15->active == false) {
          pAVar15->active = true;
          (pAVar15->callContext).ptr = pRVar20;
          if ((uint)local_4b8._16_4_ < 0x80) {
            if (0x2f < (uint)local_4b8._16_4_) {
              uVar24 = 0;
              goto LAB_003f6266;
            }
            uVar24 = 0;
            methodId = 0;
          }
          else {
            uVar24 = *(uint64_t *)(local_4b8._0_8_ + 8);
LAB_003f6266:
            methodId = (uint64_t)*(ushort *)(local_4b8._0_8_ + 4);
          }
          RpcCallContext::addRef((RpcCallContext *)&f_3);
          startCall(&promiseAndPipeline,this,uVar24,methodId,&capability,
                    (Own<capnp::CallContextHook> *)&f_3);
          kj::Own<capnp::CallContextHook>::dispose((Own<capnp::CallContextHook> *)&f_3);
          pAVar15 = ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>
                    ::operator[](&this->answers,local_378);
          f_3.exception = (Exception *)promiseAndPipeline.pipeline.disposer;
          OStack_500.disposer = (Disposer *)promiseAndPipeline.pipeline.ptr;
          promiseAndPipeline.pipeline.ptr = (PipelineHook *)0x0;
          kj::Own<capnp::PipelineHook>::operator=
                    (&(pAVar15->pipeline).ptr,(Own<capnp::PipelineHook> *)&f_3);
          kj::Own<capnp::PipelineHook>::dispose((Own<capnp::PipelineHook> *)&f_3);
          if ((bool)local_470 == false) {
            pTVar18 = (TransformPromiseNodeBase *)operator_new(0x30);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      (pTVar18,(Own<kj::_::PromiseNode> *)&promiseAndPipeline,
                       kj::_::
                       TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2366:13),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2368:16)>
                       ::anon_class_8_1_adc9bc7d_for_func::operator());
            (pTVar18->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00670798;
            pTVar18[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)pRVar20;
            pTVar18[1].dependency.disposer = (Disposer *)pRVar20;
            f_3.exception =
                 (Exception *)
                 &kj::_::
                  HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda()#1},capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#2}>>
                  ::instance;
            exportsToRelease.ptr =
                 (uint *)&kj::_::
                          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda()#1},capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#2}>>
                          ::instance;
            OStack_500.disposer = (Disposer *)0x0;
            local_3a8._16_8_ =
                 &kj::_::
                  HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda()#1},capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#2}>>
                  ::instance;
            exportsToRelease.size_ = 0;
            local_3a8._24_8_ = pTVar18;
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&exportsToRelease);
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f_3);
            pTVar18 = (TransformPromiseNodeBase *)operator_new(0x30);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      (pTVar18,(Own<kj::_::PromiseNode> *)(local_3a8 + 0x10),
                       kj::_::IdentityFunc<void>::operator());
            (pTVar18->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006708b8;
            pTVar18[1].dependency.disposer = (Disposer *)this;
            f_3.exception =
                 (Exception *)
                 &kj::_::
                  HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#3}>>
                  ::instance;
            exportsToRelease.ptr =
                 (uint *)&kj::_::
                          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#3}>>
                          ::instance;
            OStack_500.disposer = (Disposer *)0x0;
            local_388.disposer =
                 (Disposer *)
                 &kj::_::
                  HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#3}>>
                  ::instance;
            exportsToRelease.size_ = 0;
            local_388.ptr = (PromiseNode *)pTVar18;
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&exportsToRelease);
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f_3);
            capHook.disposer = &pRVar11->super_Disposer;
            context.ptr = (RpcCallContext *)0x0;
            capHook.ptr = (ClientHook *)pRVar20;
            pFVar21 = (ForkHub<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                       *)operator_new(0x28);
            kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
                      ((AttachmentPromiseNodeBase *)pFVar21,&local_388);
            (pFVar21->super_ForkHubBase).super_Refcounted.super_Disposer._vptr_Disposer =
                 (_func_int **)&PTR_onReady_00670940;
            (pFVar21->super_ForkHubBase).super_Event.loop = (EventLoop *)pRVar11;
            (pFVar21->super_ForkHubBase).super_Event.next = (Event *)pRVar20;
            capHook.ptr = (ClientHook *)0x0;
            exportsToRelease.ptr =
                 (uint *)&kj::_::
                          HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>>>
                          ::instance;
            f_3.exception =
                 (Exception *)
                 &kj::_::
                  HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>>>
                  ::instance;
            exportsToRelease.size_ = 0;
            forked.hub.disposer =
                 (Disposer *)
                 &kj::_::
                  HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>>>
                  ::instance;
            OStack_500.disposer = (Disposer *)0x0;
            forked.hub.ptr = pFVar21;
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f_3);
            kj::
            Own<kj::_::AttachmentPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>_>_>
            ::~Own((Own<kj::_::AttachmentPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>_>_>
                    *)&exportsToRelease);
            kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>::~Own
                      ((Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext> *)
                       &capHook);
            kj::Promise<void>::exclusiveJoin
                      ((Promise<void> *)&resultsPromise,(Promise<void> *)&forked);
            pTVar18 = (TransformPromiseNodeBase *)operator_new(0x28);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      (pTVar18,(Own<kj::_::PromiseNode> *)&resultsPromise,
                       kj::_::
                       TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/../kj/async-inl.h:992:25),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2375:21)>
                       ::anon_class_1_0_00000001_for_func::operator());
            (pTVar18->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006709c0;
            f_3.exception =
                 (Exception *)
                 &kj::_::
                  HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::Promise<void>::detach<capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#4}>(capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#4}&&)::{lambda()#1},capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#4}>>
                  ::instance;
            exportsToRelease.ptr =
                 (uint *)&kj::_::
                          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::Promise<void>::detach<capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#4}>(capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#4}&&)::{lambda()#1},capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#4}>>
                          ::instance;
            OStack_500.disposer = (Disposer *)0x0;
            capHook.disposer =
                 (Disposer *)
                 &kj::_::
                  HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::Promise<void>::detach<capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#4}>(capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#4}&&)::{lambda()#1},capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#4}>>
                  ::instance;
            exportsToRelease.size_ = 0;
            capHook.ptr = (ClientHook *)pTVar18;
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&exportsToRelease);
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f_3);
            kj::_::detach((Promise<void> *)&capHook);
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&capHook);
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&resultsPromise);
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&forked);
            kj::Own<kj::_::PromiseNode>::dispose(&local_388);
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_3a8 + 0x10));
          }
          else {
            OStack_500.disposer = &pRVar11->super_Disposer;
            context.ptr = (RpcCallContext *)0x0;
            OStack_500.ptr = pRVar20;
            pTVar18 = (TransformPromiseNodeBase *)operator_new(0x40);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      (pTVar18,(Own<kj::_::PromiseNode> *)&promiseAndPipeline,
                       kj::
                       CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2346:36),_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>_>
                       ::operator()<>);
            (pTVar18->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00670510;
            pTVar18[1].dependency.disposer = &refcounted->super_Disposer;
            pTVar18[1].dependency.ptr = (PromiseNode *)pRVar20;
            OStack_500.ptr = (RpcCallContext *)0x0;
            exportsToRelease.ptr =
                 (uint *)&kj::_::
                          HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>&&)#1},kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>>,kj::_::PropagateException>>
                          ::instance;
            capHook.disposer =
                 (Disposer *)
                 &kj::_::
                  HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>&&)#1},kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>>,kj::_::PropagateException>>
                  ::instance;
            exportsToRelease.size_ = 0;
            resultsPromise.super_PromiseBase.node.disposer =
                 (Disposer *)
                 &kj::_::
                  HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>&&)#1},kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>>,kj::_::PropagateException>>
                  ::instance;
            capHook.ptr = (ClientHook *)0x0;
            resultsPromise.super_PromiseBase.node.ptr = (PromiseNode *)pTVar18;
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&capHook);
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&exportsToRelease);
            kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>::~Own
                      (&OStack_500);
            kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
            ::fork((Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                    *)&forked);
            kj::
            ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
            ::addBranch((ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                         *)&f_3);
            if ((pAVar15->redirectedResults).ptr.isSet == true) {
              (pAVar15->redirectedResults).ptr.isSet = false;
              kj::Own<kj::_::PromiseNode>::dispose
                        ((Own<kj::_::PromiseNode> *)&(pAVar15->redirectedResults).ptr.field_1.value)
              ;
            }
            (pAVar15->redirectedResults).ptr.field_1.value.super_PromiseBase.node.disposer =
                 (Disposer *)f_3.exception;
            (pAVar15->redirectedResults).ptr.field_1.value.super_PromiseBase.node.ptr =
                 (PromiseNode *)OStack_500.disposer;
            OStack_500.disposer = (Disposer *)0x0;
            (pAVar15->redirectedResults).ptr.isSet = true;
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f_3);
            kj::
            ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
            ::addBranch((ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                         *)&local_1a8);
            pTVar18 = (TransformPromiseNodeBase *)operator_new(0x28);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      (pTVar18,&local_1a8,
                       kj::_::
                       TransformPromiseNode<kj::_::Void,_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2358:52),_kj::_::PropagateException>
                       ::anon_class_1_0_00000001_for_func::operator());
            (pTVar18->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00670688;
            f_3.exception =
                 (Exception *)
                 &kj::_::
                  HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>&&)#1},kj::_::PropagateException>>
                  ::instance;
            exportsToRelease.ptr =
                 (uint *)&kj::_::
                          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>&&)#1},kj::_::PropagateException>>
                          ::instance;
            OStack_500.disposer = (Disposer *)0x0;
            local_3a8._16_8_ =
                 &kj::_::
                  HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>&&)#1},kj::_::PropagateException>>
                  ::instance;
            exportsToRelease.size_ = 0;
            local_3a8._24_8_ = pTVar18;
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&exportsToRelease);
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f_3);
            kj::Promise<void>::exclusiveJoin((Promise<void> *)&local_388,&cancelPaf.promise);
            pTVar18 = (TransformPromiseNodeBase *)operator_new(0x28);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      (pTVar18,&local_388,
                       kj::_::
                       TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/../kj/async-inl.h:992:25),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2359:21)>
                       ::anon_class_1_0_00000001_for_func::operator());
            (pTVar18->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00670710;
            f_3.exception =
                 (Exception *)
                 &kj::_::
                  HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::Promise<void>::detach<capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#1}>(capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#1}&&)::{lambda()#1},capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#1}>>
                  ::instance;
            exportsToRelease.ptr =
                 (uint *)&kj::_::
                          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::Promise<void>::detach<capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#1}>(capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#1}&&)::{lambda()#1},capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#1}>>
                          ::instance;
            OStack_500.disposer = (Disposer *)0x0;
            capHook.disposer =
                 (Disposer *)
                 &kj::_::
                  HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::Promise<void>::detach<capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#1}>(capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#1}&&)::{lambda()#1},capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#1}>>
                  ::instance;
            exportsToRelease.size_ = 0;
            capHook.ptr = (ClientHook *)pTVar18;
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&exportsToRelease);
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f_3);
            kj::_::detach((Promise<void> *)&capHook);
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&capHook);
            kj::Own<kj::_::PromiseNode>::dispose(&local_388);
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_3a8 + 0x10));
            kj::Own<kj::_::PromiseNode>::dispose(&local_1a8);
            kj::
            Own<kj::_::ForkHub<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>
            ::~Own(&forked.hub);
            kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&resultsPromise);
          }
          ClientHook::VoidPromiseAndPipeline::~VoidPromiseAndPipeline(&promiseAndPipeline);
        }
        else {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[29]>
                    ((Fault *)&promiseAndPipeline,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x915,FAILED,"!answer.active","\"questionId is already in use\"",
                     (char (*) [29])"questionId is already in use");
          kj::_::Debug::Fault::~Fault((Fault *)&promiseAndPipeline);
        }
        kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>::~Own(&context)
        ;
        kj::PromiseFulfillerPair<void>::~PromiseFulfillerPair(&cancelPaf);
        kj::Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::~Array(&capTableArray);
      }
LAB_003f67d7:
      this_05 = (PromiseFulfillerPair<void> *)&capability;
LAB_003f6840:
      kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)this_05);
      return;
    case 3:
      rpc::Message::Reader::getReturn((Reader *)&cap_1,&reader);
      capTableArray.size_ = (size_t)&exportsToRelease;
      exportsToRelease.ptr = (uint *)0x0;
      exportsToRelease.size_ = 0;
      exportsToRelease.disposer = (ArrayDisposer *)0x0;
      uVar25 = 0;
      capTableArray.disposer._0_1_ = 0;
      capHook.disposer = (Disposer *)((ulong)capHook.disposer & 0xffffffffffffff00);
      if (0x1f < (uint)local_4b8._16_4_) {
        uVar25 = *(uint *)local_4b8._0_8_;
      }
      capTableArray.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)this;
      this_00 = ExportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Question>
                ::find(&this->questions,uVar25);
      if (this_00.ptr == (Question *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
                  ((Fault *)&resolve,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0xa05,FAILED,(char *)0x0,"\"Invalid question ID in Return message.\"",
                   (char (*) [39])"Invalid question ID in Return message.");
        kj::_::Debug::Fault::~Fault((Fault *)&resolve);
      }
      else if ((this_00.ptr)->isAwaitingReturn == false) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18]>
                  ((Fault *)&resolve,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x9b5,FAILED,"question->isAwaitingReturn","\"Duplicate Return.\"",
                   (char (*) [18])"Duplicate Return.");
        kj::_::Debug::Fault::~Fault((Fault *)&resolve);
      }
      else {
        (this_00.ptr)->isAwaitingReturn = false;
        if (((uint)local_4b8._16_4_ < 0x21) || ((*(byte *)(local_4b8._0_8_ + 4) & 1) == 0)) {
          kj::Array<unsigned_int>::operator=(&exportsToRelease,&(this_00.ptr)->paramExports);
        }
        else {
          kj::Array<unsigned_int>::dispose(&(this_00.ptr)->paramExports);
        }
        pFVar21 = (ForkHub<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                   *)((this_00.ptr)->selfRef).ptr;
        if (pFVar21 ==
            (ForkHub<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> *)
            0x0) {
          if ((uint)local_4b8._16_4_ < 0x40) {
LAB_003f5e7e:
            uVar25 = 0;
            if (0x1f < (uint)local_4b8._16_4_) goto LAB_003f5e8d;
          }
          else {
            if (*(short *)(local_4b8._0_8_ + 6) == 4) {
              uVar25 = 0;
              if (0x5f < (uint)local_4b8._16_4_) {
                uVar25 = *(uint *)(local_4b8._0_8_ + 8);
              }
              MVar16 = ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>
                       ::find(&this->answers,uVar25);
              if (MVar16.ptr != (Answer *)0x0) {
                kj::
                Maybe<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>
                ::operator=((Maybe<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>
                             *)&capHook,&(MVar16.ptr)->redirectedResults);
                goto LAB_003f5e7e;
              }
            }
LAB_003f5e8d:
            uVar25 = *(uint *)local_4b8._0_8_;
          }
          ExportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Question>::
          erase((Question *)&resolve,&this->questions,uVar25,(Question *)entry);
          kj::Array<unsigned_int>::~Array((Array<unsigned_int> *)&resolve);
        }
        else if ((uint)local_4b8._16_4_ < 0x40) {
switchD_003f5ef5_caseD_0:
          if ((this_00.ptr)->isTailCall == true) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[67]>
                      ((Fault *)&resolve,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0x9c2,FAILED,"!question->isTailCall",
                       "\"Tail call `Return` must set `resultsSentElsewhere`, not `results`.\"",
                       (char (*) [67])
                       "Tail call `Return` must set `resultsSentElsewhere`, not `results`.");
            kj::_::Debug::Fault::~Fault((Fault *)&resolve);
          }
          else {
            rpc::Return::Reader::getResults((Reader *)&resolve,(Reader *)&cap_1);
            rpc::Payload::Reader::getCapTable((Reader *)&cap,(Reader *)&resolve);
            capTable_00.reader.capTable = cap._reader.capTable;
            capTable_00.reader.segment = cap._reader.segment;
            capTable_00.reader.ptr = (byte *)cap._reader.data;
            capTable_00.reader._24_8_ = cap._reader.pointers;
            capTable_00.reader.structDataSize = cap._reader.dataSize;
            capTable_00.reader.structPointerCount = cap._reader.pointerCount;
            capTable_00.reader.elementSize = cap._reader._38_1_;
            capTable_00.reader._39_1_ = cap._reader._39_1_;
            capTable_00.reader.nestingLimit = cap._reader.nestingLimit;
            capTable_00.reader._44_4_ = cap._reader._44_4_;
            receiveCaps((Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)&capability,this,
                        capTable_00);
            puVar1 = &(pFVar21->super_ForkHubBase).super_Refcounted.refcount;
            *puVar1 = *puVar1 + 1;
            bVar27 = resolve._reader.pointerCount != 0;
            promiseAndPipeline.pipeline.disposer = (Disposer *)(WirePointer *)0x0;
            if (bVar27) {
              promiseAndPipeline.pipeline.disposer = (Disposer *)resolve._reader.pointers;
            }
            iVar13 = 0x7fffffff;
            if (bVar27) {
              iVar13 = resolve._reader.nestingLimit;
            }
            _local_378 = (SegmentReader *)0x0;
            uStack_370 = (CapTableReader *)0x0;
            if (bVar27) {
              _local_378 = resolve._reader.segment;
              uStack_370 = resolve._reader.capTable;
            }
            forked.hub.disposer = (Disposer *)pFVar21;
            forked.hub.ptr = pFVar21;
            pRVar20 = (RpcCallContext *)operator_new(0x88);
            cancelPaf.promise.super_PromiseBase.node.ptr = (PromiseNode *)capability.ptr;
            cancelPaf.promise.super_PromiseBase.node.disposer = capability.disposer;
            capability.disposer = (Disposer *)0x0;
            capability.ptr = (ClientHook *)0x0;
            (pRVar20->super_Refcounted).refcount = 0;
            (pRVar20->super_CallContextHook)._vptr_CallContextHook =
                 (_func_int **)&PTR__RpcResponseImpl_00670ac8;
            (pRVar20->super_Refcounted).super_Disposer._vptr_Disposer =
                 (_func_int **)&PTR_disposeImpl_00670af8;
            puVar1 = &(this->super_Refcounted).refcount;
            *puVar1 = *puVar1 + 1;
            (pRVar20->connectionState).disposer = &(this->super_Refcounted).super_Disposer;
            (pRVar20->connectionState).ptr = this;
            pIVar8 = message->ptr;
            *(Disposer **)&pRVar20->answerId = message->disposer;
            pRVar20->interfaceId = (uint64_t)pIVar8;
            message->ptr = (IncomingRpcMessage *)0x0;
            cancelPaf.fulfiller.disposer = (Disposer *)local_3a8._0_8_;
            f_3.exception = (Exception *)0x0;
            OStack_500.disposer = (Disposer *)0x0;
            ReaderCapabilityTable::ReaderCapabilityTable
                      ((ReaderCapabilityTable *)&pRVar20->methodId,
                       (Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)&cancelPaf);
            kj::Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::~Array
                      ((Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)&cancelPaf);
            promiseAndPipeline.promise.super_PromiseBase.node.disposer = (Disposer *)_local_378;
            promiseAndPipeline.promise.super_PromiseBase.node.ptr = (PromiseNode *)uStack_370;
            promiseAndPipeline.pipeline.ptr =
                 (PipelineHook *)CONCAT44(promiseAndPipeline.pipeline.ptr._4_4_,iVar13);
            PointerReader::imbue
                      ((PointerReader *)&pRVar20->paramsCapTable,
                       (PointerReader *)&promiseAndPipeline,(CapTableReader *)&pRVar20->methodId);
            (pRVar20->params).reader.segment = (SegmentReader *)pFVar21;
            (pRVar20->params).reader.capTable = (CapTableReader *)pFVar21;
            forked.hub.ptr =
                 (ForkHub<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                  *)0x0;
            puVar1 = &(pRVar20->super_Refcounted).refcount;
            *puVar1 = *puVar1 + 1;
            resultsPromise.super_PromiseBase.node.disposer =
                 &(pRVar20->super_Refcounted).super_Disposer;
            kj::Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::~Array
                      ((Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)&f_3);
            resultsPromise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
            context.disposer = &(pRVar20->super_Refcounted).super_Disposer;
            context.ptr = pRVar20;
            QuestionRef::fulfill
                      ((QuestionRef *)pFVar21,
                       (Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse> *)
                       &context);
            kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>::~Own
                      ((Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse> *)
                       &context);
            kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponseImpl>::~Own
                      ((Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponseImpl> *)
                       &resultsPromise);
            kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>::~Own
                      ((Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef> *)
                       &forked);
            kj::Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::~Array
                      ((Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)&capability);
          }
        }
        else {
          switch(*(undefined2 *)(local_4b8._0_8_ + 6)) {
          case 0:
            goto switchD_003f5ef5_caseD_0;
          case 1:
            if ((this_00.ptr)->isTailCall == true) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[69]>
                        ((Fault *)&resolve,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                         ,0x9d0,FAILED,"!question->isTailCall",
                         "\"Tail call `Return` must set `resultsSentElsewhere`, not `exception`.\"",
                         (char (*) [69])
                         "Tail call `Return` must set `resultsSentElsewhere`, not `exception`.");
              kj::_::Debug::Fault::~Fault((Fault *)&resolve);
            }
            else {
              rpc::Return::Reader::getException((Reader *)&cap,(Reader *)&cap_1);
              toException((Exception *)&resolve,(Reader *)&cap);
              pPVar7 = *(PromiseFulfiller<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>
                         **)&(pFVar21->super_ForkHubBase).super_Event.firing;
              (*pPVar7->_vptr_PromiseFulfiller[1])(pPVar7,&resolve);
              kj::Exception::~Exception((Exception *)&resolve);
            }
            break;
          case 2:
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
                      ((Fault *)&resolve,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0x9d8,FAILED,(char *)0x0,
                       "\"Return message falsely claims call was canceled.\"",
                       (char (*) [49])"Return message falsely claims call was canceled.");
            kj::_::Debug::Fault::~Fault((Fault *)&resolve);
            break;
          case 3:
            if ((this_00.ptr)->isTailCall == false) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[66]>
                        ((Fault *)&resolve,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                         ,0x9dd,FAILED,"question->isTailCall",
                         "\"`Return` had `resultsSentElsewhere` but this was not a tail call.\"",
                         (char (*) [66])
                         "`Return` had `resultsSentElsewhere` but this was not a tail call.");
              kj::_::Debug::Fault::~Fault((Fault *)&resolve);
            }
            else {
              resolve._reader.segment = (SegmentReader *)0x0;
              resolve._reader.capTable = (CapTableReader *)0x0;
              QuestionRef::fulfill
                        ((QuestionRef *)pFVar21,
                         (Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse> *)
                         &resolve);
              kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>::~Own
                        ((Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse> *)
                         &resolve);
            }
            break;
          case 4:
            uVar25 = 0;
            if (0x5f < (uint)local_4b8._16_4_) {
              uVar25 = *(uint *)(local_4b8._0_8_ + 8);
            }
            MVar16 = ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>
                     ::find(&this->answers,uVar25);
            if (MVar16.ptr == (Answer *)0x0) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[54]>
                        ((Fault *)&resolve,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                         ,0x9ee,FAILED,(char *)0x0,
                         "\"`Return.takeFromOtherQuestion` had invalid answer ID.\"",
                         (char (*) [54])"`Return.takeFromOtherQuestion` had invalid answer ID.");
              kj::_::Debug::Fault::~Fault((Fault *)&resolve);
            }
            else if (((MVar16.ptr)->redirectedResults).ptr.isSet == true) {
              pPVar7 = *(PromiseFulfiller<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>
                         **)&(pFVar21->super_ForkHubBase).super_Event.firing;
              (**pPVar7->_vptr_PromiseFulfiller)
                        (pPVar7,&((MVar16.ptr)->redirectedResults).ptr.field_1);
            }
            else {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[92]>
                        ((Fault *)&resolve,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                         ,0x9eb,FAILED,(char *)0x0,
                         "\"`Return.takeFromOtherQuestion` referenced a call that did not \" \"use `sendResultsTo.yourself`.\""
                         ,(char (*) [92])
                          "`Return.takeFromOtherQuestion` referenced a call that did not use `sendResultsTo.yourself`."
                        );
              kj::_::Debug::Fault::~Fault((Fault *)&resolve);
            }
            break;
          default:
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                      ((Fault *)&resolve,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0x9f4,FAILED,(char *)0x0,"\"Unknown \'Return\' type.\"",
                       (char (*) [23])"Unknown \'Return\' type.");
            kj::_::Debug::Fault::~Fault((Fault *)&resolve);
          }
        }
      }
      kj::
      Maybe<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>
      ::~Maybe((Maybe<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>
                *)&capHook);
      kj::_::
      Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2481:5)>
      ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_c__:2481:5)>
                   *)&capTableArray);
      this_04 = (VoidPromiseAndPipeline *)&exportsToRelease;
LAB_003f5feb:
      kj::Array<unsigned_int>::~Array((Array<unsigned_int> *)this_04);
      return;
    case 4:
      rpc::Message::Reader::getFinish((Reader *)&cap_1,&reader);
      cancelPaf.promise.super_PromiseBase.node.ptr = (PromiseNode *)&promiseAndPipeline;
      promiseAndPipeline.promise.super_PromiseBase.node.disposer = (Disposer *)0x0;
      promiseAndPipeline.promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      promiseAndPipeline.pipeline.disposer = (Disposer *)0x0;
      uVar25 = 0;
      cancelPaf.fulfiller.disposer =
           (Disposer *)((ulong)cancelPaf.fulfiller.disposer & 0xffffffffffffff00);
      resolve._reader.segment =
           (SegmentReader *)((ulong)resolve._reader.segment & 0xffffffffffffff00);
      resolve._reader.capTable = (CapTableReader *)0x0;
      resolve._reader.data = (void *)0x0;
      resolve._reader.pointers =
           (WirePointer *)((ulong)resolve._reader.pointers & 0xffffffffffffff00);
      f_3.exception = (Exception *)0x0;
      OStack_500.disposer = (Disposer *)0x0;
      this_01 = &this->answers;
      if (0x1f < (uint)local_4b8._16_4_) {
        uVar25 = *(uint *)local_4b8._0_8_;
      }
      this_02 = this_01;
      cancelPaf.promise.super_PromiseBase.node.disposer = (Disposer *)this;
      MVar16 = ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>
               ::find(this_01,uVar25);
      if (MVar16.ptr == (Answer *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                  ((Fault *)this_02,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0xa24,FAILED,"answer->active","\"\'Finish\' for invalid question ID.\"",
                   (char (*) [34])"\'Finish\' for invalid question ID.");
        kj::_::Debug::Fault::~Fault((Fault *)this_02);
      }
      else if ((MVar16.ptr)->active == false) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                  ((Fault *)&cap,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0xa12,FAILED,"answer->active","\"\'Finish\' for invalid question ID.\"",
                   (char (*) [34])"\'Finish\' for invalid question ID.");
        kj::_::Debug::Fault::~Fault((Fault *)&cap);
      }
      else {
        if (((uint)local_4b8._16_4_ < 0x21) || ((*(byte *)(local_4b8._0_8_ + 4) & 1) == 0)) {
          kj::Array<unsigned_int>::operator=
                    ((Array<unsigned_int> *)&promiseAndPipeline,&(MVar16.ptr)->resultExports);
        }
        else {
          kj::Array<unsigned_int>::dispose(&(MVar16.ptr)->resultExports);
        }
        kj::Own<capnp::PipelineHook>::operator=
                  ((Own<capnp::PipelineHook> *)&f_3,&((MVar16.ptr)->pipeline).ptr);
        pRVar20 = ((MVar16.ptr)->callContext).ptr;
        if (pRVar20 == (RpcCallContext *)0x0) {
          uVar25 = 0;
          if (0x1f < (uint)local_4b8._16_4_) {
            uVar25 = *(uint *)local_4b8._0_8_;
          }
          ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>::
          erase((Answer *)&cap,this_01,uVar25);
          Answer::operator=((Answer *)&resolve,(Answer *)&cap);
          Answer::~Answer((Answer *)&cap);
        }
        else {
          RpcCallContext::requestCancel(pRVar20);
        }
      }
      kj::Own<capnp::PipelineHook>::dispose((Own<capnp::PipelineHook> *)&f_3);
      Answer::~Answer((Answer *)&resolve);
      kj::_::
      Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2573:5)>
      ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_c__:2573:5)>
                   *)&cancelPaf);
      this_04 = &promiseAndPipeline;
      goto LAB_003f5feb;
    case 5:
      rpc::Message::Reader::getResolve((Reader *)&promiseAndPipeline,&reader);
      cancelPaf.promise.super_PromiseBase.node.disposer = (Disposer *)0x0;
      cancelPaf.promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      resolve._reader.segment =
           (SegmentReader *)((ulong)resolve._reader.segment & 0xffffffffffffff00);
      if ((uint)local_3d8 < 0x30) {
LAB_003f500a:
        rpc::Resolve::Reader::getCap(&cap,(Reader *)&promiseAndPipeline);
        descriptor._reader.capTable = cap._reader.capTable;
        descriptor._reader.segment = cap._reader.segment;
        descriptor._reader.data = cap._reader.data;
        descriptor._reader.pointers = cap._reader.pointers;
        descriptor._reader.dataSize = cap._reader.dataSize;
        descriptor._reader.pointerCount = cap._reader.pointerCount;
        descriptor._reader._38_2_ = cap._reader._38_2_;
        descriptor._reader.nestingLimit = cap._reader.nestingLimit;
        descriptor._reader._44_4_ = cap._reader._44_4_;
        receiveCap((RpcConnectionState *)&f_3,descriptor);
        pDVar9 = OStack_500.disposer;
        cap_1.value.disposer = (Disposer *)f_3.exception;
        cap_1.value.ptr = (ClientHook *)OStack_500.disposer;
        OStack_500.disposer = (Disposer *)0x0;
        kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&f_3);
        if ((WirePointer *)pDVar9 == (WirePointer *)0x0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
                    (&f_3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0xa35,FAILED,(char *)0x0,"\"\'Resolve\' contained \'CapDescriptor.none\'.\"",
                     (char (*) [42])"\'Resolve\' contained \'CapDescriptor.none\'.");
          kj::_::Debug::Fault::~Fault(&f_3);
        }
        else {
          kj::Own<capnp::ClientHook>::operator=((Own<capnp::ClientHook> *)&cancelPaf,&cap_1.value);
        }
        kj::Own<capnp::ClientHook>::dispose(&cap_1.value);
        if ((WirePointer *)pDVar9 != (WirePointer *)0x0) {
LAB_003f5a67:
          uVar25 = 0;
          if (0x1f < (uint)local_3d8) {
            uVar25 = *(uint *)&(promiseAndPipeline.pipeline.disposer)->_vptr_Disposer;
          }
          MVar19 = ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Import>
                   ::find(&this->imports,uVar25);
          if (MVar19.ptr != (Import *)0x0) {
            pPVar4 = ((MVar19.ptr)->promiseFulfiller).ptr.ptr;
            if (pPVar4 == (PromiseFulfiller<kj::Own<capnp::ClientHook>_> *)0x0) {
              if (((MVar19.ptr)->importClient).ptr != (ImportClient *)0x0) {
                kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
                          ((Fault *)&cap_1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                           ,0xa50,FAILED,(char *)0x0,"\"Got \'Resolve\' for a non-promise import.\""
                           ,(char (*) [40])"Got \'Resolve\' for a non-promise import.");
                kj::_::Debug::Fault::~Fault((Fault *)&cap_1);
              }
            }
            else if ((char)resolve._reader.segment == '\x01') {
              (*pPVar4->_vptr_PromiseFulfiller[1])(pPVar4,&resolve._reader.capTable);
            }
            else {
              (**pPVar4->_vptr_PromiseFulfiller)(pPVar4,&cancelPaf);
            }
          }
        }
      }
      else {
        sVar2 = *(short *)((long)&(promiseAndPipeline.pipeline.disposer)->_vptr_Disposer + 4);
        if (sVar2 == 1) {
          rpc::Resolve::Reader::getException((Reader *)&cap_1,(Reader *)&promiseAndPipeline);
          toException((Exception *)&cap,(Reader *)&cap_1);
          kj::_::NullableValue<kj::Exception>::emplace<kj::Exception>
                    ((NullableValue<kj::Exception> *)&resolve,(Exception *)&cap);
          kj::Exception::~Exception((Exception *)&cap);
          goto LAB_003f5a67;
        }
        if (sVar2 == 0) goto LAB_003f500a;
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                  ((Fault *)&cap,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0xa41,FAILED,(char *)0x0,"\"Unknown \'Resolve\' type.\"",
                   (char (*) [24])"Unknown \'Resolve\' type.");
        kj::_::Debug::Fault::~Fault((Fault *)&cap);
      }
      kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&resolve);
      this_05 = &cancelPaf;
      goto LAB_003f6840;
    case 6:
      rpc::Message::Reader::getRelease((Reader *)&resolve,&reader);
      refcount = 0;
      if (resolve._reader.dataSize < 0x20) {
        uVar25 = 0;
      }
      else {
        uVar25 = *resolve._reader.data;
        if (0x3f < resolve._reader.dataSize) {
          refcount = *(uint *)((long)resolve._reader.data + 4);
        }
      }
      goto LAB_003f5719;
    default:
      if ((this->connection).tag != 1) {
        return;
      }
      puVar3 = *(undefined8 **)((long)&(this->connection).field_1 + 8);
      MVar28 = StructReader::totalSize(&reader._reader);
      uVar23 = (ulong)(MVar28.capCount << 2) + MVar28.wordCount;
      if (0xfffff < uVar23) {
        uVar23 = 0x100000;
      }
      (**(code **)*puVar3)(&f_3,puVar3,(int)uVar23 + 3);
      (**(_func_int **)*(WirePointer *)OStack_500.disposer)(&cancelPaf);
      AnyPointer::Builder::initAs<capnp::rpc::Message>
                ((BuilderFor<capnp::rpc::Message> *)&cap_1,(Builder *)&cancelPaf);
      cap._reader.nestingLimit = reader._reader.nestingLimit;
      cap._reader._44_4_ = reader._reader._44_4_;
      cap._reader.data = reader._reader.data;
      cap._reader.pointers = reader._reader.pointers;
      cap._reader.segment = reader._reader.segment;
      cap._reader.capTable = reader._reader.capTable;
      *(undefined2 *)local_4b8._0_8_ = 0;
      resolve._reader.nestingLimit = reader._reader.nestingLimit;
      resolve._reader._44_4_ = reader._reader._44_4_;
      resolve._reader.data = reader._reader.data;
      resolve._reader.pointers = reader._reader.pointers;
      resolve._reader.segment = reader._reader.segment;
      resolve._reader.capTable = reader._reader.capTable;
      promiseAndPipeline.promise.super_PromiseBase.node.disposer = cap_1.value.disposer;
      promiseAndPipeline.promise.super_PromiseBase.node.ptr = (PromiseNode *)cap_1.value.ptr;
      PointerBuilder::setStruct((PointerBuilder *)&promiseAndPipeline,&resolve._reader,false);
      (**(_func_int **)((long)*(WirePointer *)OStack_500.disposer + 8))();
      this_03 = (Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)&f_3;
      break;
    case 8:
      rpc::Message::Reader::getBootstrap((Reader *)&promiseAndPipeline,&reader);
      uVar25 = 0;
      if (0x1f < (uint)local_3d8) {
        uVar25 = *(uint *)&(promiseAndPipeline.pipeline.disposer)->_vptr_Disposer;
      }
      context.disposer = (Disposer *)CONCAT44(context.disposer._4_4_,uVar25);
      if ((this->connection).tag != 1) {
        return;
      }
      puVar3 = *(undefined8 **)((long)&(this->connection).field_1 + 8);
      (**(code **)*puVar3)(&capTableArray,puVar3,0x28);
      (*(code *)**(undefined8 **)capTableArray.size_)(&cap);
      AnyPointer::Builder::getAs<capnp::rpc::Message>
                ((BuilderFor<capnp::rpc::Message> *)&resolve,(Builder *)&cap);
      rpc::Message::Builder::initReturn((Builder *)&cancelPaf,(Builder *)&resolve);
      *(uint *)&(cancelPaf.fulfiller.disposer)->_vptr_Disposer = uVar25;
      capHook.disposer = (Disposer *)0x0;
      capHook.ptr = (ClientHook *)0x0;
      exportsToRelease.size_ = (size_t)&f_3;
      f_3.exception = (Exception *)0x0;
      OStack_500.disposer = (Disposer *)0x0;
      OStack_500.ptr = (RpcCallContext *)0x0;
      exportsToRelease.disposer =
           (ArrayDisposer *)((ulong)exportsToRelease.disposer & 0xffffffffffffff00);
      cap_1.value.disposer = (Disposer *)&PTR_run_0066f260;
      exportsToRelease.ptr = (uint *)this;
      cap_1.value.ptr = (ClientHook *)&promiseAndPipeline;
      kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&cap,(Runnable *)&cap_1);
      kj::_::NullableValue<kj::Exception>::NullableValue
                ((NullableValue<kj::Exception> *)&resolve,(NullableValue<kj::Exception> *)&cap);
      kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&cap);
      if ((char)resolve._reader.segment == '\x01') {
        rpc::Return::Builder::initException((Builder *)&cap,(Builder *)&cancelPaf);
        builder._builder.capTable = (CapTableBuilder *)cap._reader.capTable;
        builder._builder.segment = (SegmentBuilder *)cap._reader.segment;
        builder._builder.data = cap._reader.data;
        builder._builder.pointers = cap._reader.pointers;
        builder._builder.dataSize = cap._reader.dataSize;
        builder._builder.pointerCount = cap._reader.pointerCount;
        builder._builder._38_2_ = cap._reader._38_2_;
        fromException((Exception *)&resolve._reader.capTable,builder);
        newBrokenCap((Exception *)&cap_1);
        kj::Own<capnp::ClientHook>::operator=(&capHook,&cap_1.value);
        kj::Own<capnp::ClientHook>::dispose(&cap_1.value);
      }
      kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&resolve);
      kj::Own<capnp::IncomingRpcMessage>::dispose(message);
      pAVar15 = ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>
                ::operator[](&this->answers,uVar25);
      if (pAVar15->active == false) {
        kj::Array<unsigned_int>::operator=(&pAVar15->resultExports,(Array<unsigned_int> *)&f_3);
        pAVar15->active = true;
        resolve._reader.capTable = (CapTableReader *)operator_new(0x28);
        cap_1.value.disposer = (Disposer *)(resolve._reader.capTable + 1);
        (resolve._reader.capTable)->_vptr_CapTableReader = (_func_int **)&PTR_addRef_0066f3a0;
        resolve._reader.capTable[1]._vptr_CapTableReader = (_func_int **)&PTR_disposeImpl_0066f3d8;
        resolve._reader.capTable[3]._vptr_CapTableReader = (_func_int **)capHook.disposer;
        resolve._reader.capTable[4]._vptr_CapTableReader = (_func_int **)capHook.ptr;
        capHook.ptr = (ClientHook *)0x0;
        *(undefined4 *)&resolve._reader.capTable[2]._vptr_CapTableReader = 1;
        capability.ptr = (ClientHook *)0x0;
        cap_1.value.ptr = (ClientHook *)0x0;
        capability.disposer = cap_1.value.disposer;
        resolve._reader.segment = (SegmentReader *)cap_1.value.disposer;
        kj::Own<capnp::PipelineHook>::operator=
                  (&(pAVar15->pipeline).ptr,(Own<capnp::PipelineHook> *)&resolve);
        kj::Own<capnp::PipelineHook>::dispose((Own<capnp::PipelineHook> *)&resolve);
        kj::Own<capnp::PipelineHook>::dispose((Own<capnp::PipelineHook> *)&cap_1);
        kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::SingleCapPipeline>::~Own
                  ((Own<capnp::_::(anonymous_namespace)::RpcConnectionState::SingleCapPipeline> *)
                   &capability);
        (**(code **)(*(long *)capTableArray.size_ + 8))();
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[29],unsigned_int&>
                  ((Fault *)&resolve,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x8e4,FAILED,"!answer.active","\"questionId is already in use\", answerId",
                   (char (*) [29])"questionId is already in use",(uint *)&context);
        kj::_::Debug::Fault::~Fault((Fault *)&resolve);
      }
      kj::_::
      Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2242:5)>
      ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_c__:2242:5)>
                   *)&exportsToRelease);
      kj::Array<unsigned_int>::~Array((Array<unsigned_int> *)&f_3);
      kj::Own<capnp::ClientHook>::dispose(&capHook);
      this_03 = &capTableArray;
      break;
    case 0xd:
      rpc::Message::Reader::getDisembargo((Reader *)&cap,&reader);
      if (0x2f < cap._reader.dataSize) {
        if (*(short *)((long)cap._reader.data + 4) == 1) {
          pEVar5 = (this->embargoes).slots.builder.ptr;
          if (((ulong)*cap._reader.data <
               (ulong)((long)(this->embargoes).slots.builder.pos - (long)pEVar5 >> 4)) &&
             (pPVar6 = pEVar5[*cap._reader.data].fulfiller.ptr.ptr,
             pPVar6 != (PromiseFulfiller<void> *)0x0)) {
            (**pPVar6->_vptr_PromiseFulfiller)(pPVar6,&resolve);
            uVar25 = *cap._reader.data;
            cap_1.value.disposer = (Disposer *)CONCAT44(cap_1.value.disposer._4_4_,uVar25);
            pEVar5 = (this->embargoes).slots.builder.ptr;
            capTableArray.ptr =
                 (Maybe<kj::Own<capnp::ClientHook>_> *)pEVar5[uVar25].fulfiller.ptr.disposer;
            capTableArray.size_ = (size_t)pEVar5[uVar25].fulfiller.ptr.ptr;
            pEVar5[uVar25].fulfiller.ptr.ptr = (PromiseFulfiller<void> *)0x0;
            resolve._reader.segment = (SegmentReader *)0x0;
            resolve._reader.capTable = (CapTableReader *)0x0;
            kj::Own<kj::PromiseFulfiller<void>_>::operator=
                      ((Own<kj::PromiseFulfiller<void>_> *)(pEVar5 + uVar25),
                       (Own<kj::PromiseFulfiller<void>_> *)&resolve);
            kj::Own<kj::PromiseFulfiller<void>_>::dispose
                      ((Own<kj::PromiseFulfiller<void>_> *)&resolve);
            std::
            priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
            ::push(&(this->embargoes).freeIds,(value_type *)&cap_1);
            kj::Own<kj::PromiseFulfiller<void>_>::dispose
                      ((Own<kj::PromiseFulfiller<void>_> *)&capTableArray);
            return;
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
                    ((Fault *)&resolve,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0xab8,FAILED,(char *)0x0,
                     "\"Invalid embargo ID in \'Disembargo.context.receiverLoopback\'.\"",
                     (char (*) [61])"Invalid embargo ID in \'Disembargo.context.receiverLoopback\'."
                    );
LAB_003f6814:
          kj::_::Debug::Fault::~Fault((Fault *)&resolve);
          return;
        }
        if (*(short *)((long)cap._reader.data + 4) != 0) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,char_const(&)[31],capnp::rpc::Disembargo::Reader_const&>
                    ((Fault *)&resolve,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0xac0,FAILED,(char *)0x0,"\"Unimplemented Disembargo type.\", disembargo",
                     (char (*) [31])"Unimplemented Disembargo type.",(Reader *)&cap);
          goto LAB_003f6814;
        }
      }
      f_3.exception = (Exception *)0x0;
      OStack_500.disposer = (Disposer *)0x0;
      rpc::Disembargo::Reader::getTarget((Reader *)&resolve,(Reader *)&cap);
      getMessageTarget((RpcConnectionState *)&promiseAndPipeline,(Reader *)this);
      cap_1.value.disposer = promiseAndPipeline.promise.super_PromiseBase.node.disposer;
      cap_1.value.ptr = (ClientHook *)promiseAndPipeline.promise.super_PromiseBase.node.ptr;
      promiseAndPipeline.promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&promiseAndPipeline);
      pCVar10 = cap_1.value.ptr;
      if (cap_1.value.ptr != (ClientHook *)0x0) {
        kj::Own<capnp::ClientHook>::operator=((Own<capnp::ClientHook> *)&f_3,&cap_1.value);
      }
      kj::Own<capnp::ClientHook>::dispose(&cap_1.value);
      if (pCVar10 != (ClientHook *)0x0) {
        while( true ) {
          iVar13 = (**(_func_int **)((long)*(WirePointer *)OStack_500.disposer + 0x10))();
          plVar17 = (long *)CONCAT44(extraout_var,iVar13);
          if (plVar17 == (long *)0x0) break;
          (**(code **)(*plVar17 + 0x20))((Own<capnp::ClientHook> *)&resolve,plVar17);
          kj::Own<capnp::ClientHook>::operator=
                    ((Own<capnp::ClientHook> *)&f_3,(Own<capnp::ClientHook> *)&resolve);
          kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&resolve);
        }
        iVar13 = (**(_func_int **)((long)*(WirePointer *)OStack_500.disposer + 0x28))();
        if ((RpcConnectionState *)CONCAT44(extraout_var_00,iVar13) == this) {
          uVar14 = 0;
          if (0x1f < cap._reader.dataSize) {
            uVar14 = *cap._reader.data;
          }
          resolve._reader.capTable =
               (CapTableReader *)CONCAT44(resolve._reader.capTable._4_4_,uVar14);
          resolve._reader.data = f_3.exception;
          resolve._reader.pointers = (WirePointer *)OStack_500.disposer;
          OStack_500.disposer = (Disposer *)0x0;
          resolve._reader.segment = (SegmentReader *)this;
          kj::_::yield();
          pTVar18 = (TransformPromiseNodeBase *)operator_new(0x48);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (pTVar18,(Own<kj::_::PromiseNode> *)&cancelPaf,
                     kj::
                     CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2705:21),_kj::Own<capnp::ClientHook>_>
                     ::operator()<>);
          (pTVar18->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00670b58;
          pTVar18[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)resolve._reader.segment;
          pTVar18[1].dependency.disposer = (Disposer *)resolve._reader.capTable;
          pTVar18[1].dependency.ptr = (PromiseNode *)resolve._reader.data;
          pTVar18[1].continuationTracePtr = resolve._reader.pointers;
          resolve._reader.pointers = (WirePointer *)0x0;
          cap_1.value.disposer =
               (Disposer *)
               &kj::_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::handleDisembargo(capnp::rpc::Disembargo::Reader_const&)::{lambda(kj::Own<capnp::ClientHook>&&)#1},kj::Own<capnp::ClientHook>>,kj::_::PropagateException>>
                ::instance;
          promiseAndPipeline.promise.super_PromiseBase.node.disposer =
               (Disposer *)
               &kj::_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::handleDisembargo(capnp::rpc::Disembargo::Reader_const&)::{lambda(kj::Own<capnp::ClientHook>&&)#1},kj::Own<capnp::ClientHook>>,kj::_::PropagateException>>
                ::instance;
          cap_1.value.ptr = (ClientHook *)0x0;
          exportsToRelease.ptr =
               (uint *)&kj::_::
                        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::handleDisembargo(capnp::rpc::Disembargo::Reader_const&)::{lambda(kj::Own<capnp::ClientHook>&&)#1},kj::Own<capnp::ClientHook>>,kj::_::PropagateException>>
                        ::instance;
          promiseAndPipeline.promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
          exportsToRelease.size_ = (size_t)pTVar18;
          kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promiseAndPipeline);
          kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&cap_1);
          kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&cancelPaf);
          kj::TaskSet::add(&this->tasks,(Promise<void> *)&exportsToRelease);
          kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&exportsToRelease);
          kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&resolve._reader.data);
        }
        else {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[96]>
                    ((Fault *)&resolve,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0xa88,FAILED,"target->getBrand() == this",
                     "\"\'Disembargo\' of type \'senderLoopback\' sent to an object that does not point \" \"back to the sender.\""
                     ,(char (*) [96])
                      "\'Disembargo\' of type \'senderLoopback\' sent to an object that does not point back to the sender."
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&resolve);
        }
      }
      this_05 = (PromiseFulfillerPair<void> *)&f_3;
      goto LAB_003f6840;
    }
    kj::Own<capnp::OutgoingRpcMessage>::dispose((Own<capnp::OutgoingRpcMessage> *)this_03);
    return;
  }
switchD_003f4e9c_caseD_0:
  rpc::Message::Reader::getUnimplemented((Reader *)&promiseAndPipeline,&reader);
  if ((uint)local_3d8 < 0x10) {
    uVar25 = 0;
  }
  else {
    uVar25 = (uint)*(ushort *)&(promiseAndPipeline.pipeline.disposer)->_vptr_Disposer;
    if (*(ushort *)&(promiseAndPipeline.pipeline.disposer)->_vptr_Disposer == 5) {
      rpc::Message::Reader::getResolve(&resolve,(Reader *)&promiseAndPipeline);
      if ((0x2f < resolve._reader.dataSize) && (*(short *)((long)resolve._reader.data + 4) != 0)) {
        return;
      }
      rpc::Resolve::Reader::getCap(&cap,&resolve);
      if (cap._reader.dataSize < 0x10) {
        return;
      }
      sVar2 = *cap._reader.data;
      if (sVar2 == 5) {
        rpc::CapDescriptor::Reader::getThirdPartyHosted((Reader *)&cap_1,&cap);
        uVar25 = 0;
        if (0x1f < (uint)local_4b8._16_4_) {
          uVar25 = *(uint *)local_4b8._0_8_;
        }
      }
      else {
        if ((sVar2 != 2) && (sVar2 != 1)) {
          return;
        }
        uVar25 = 0;
        if (0x3f < cap._reader.dataSize) {
          uVar25 = *(uint *)((long)cap._reader.data + 4);
        }
      }
      refcount = 1;
LAB_003f5719:
      releaseExport(this,uVar25,refcount);
      return;
    }
  }
  cap._reader.segment = (SegmentReader *)CONCAT44(cap._reader.segment._4_4_,uVar25);
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50],unsigned_int>
            ((Fault *)&resolve,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
             ,0x88f,FAILED,(char *)0x0,
             "\"Peer did not implement required RPC message type.\", (uint)message.which()",
             (char (*) [50])"Peer did not implement required RPC message type.",(uint *)&cap);
  kj::_::Debug::Fault::fatal((Fault *)&resolve);
}

Assistant:

void handleMessage(kj::Own<IncomingRpcMessage> message) {
    auto reader = message->getBody().getAs<rpc::Message>();

    switch (reader.which()) {
      case rpc::Message::UNIMPLEMENTED:
        handleUnimplemented(reader.getUnimplemented());
        break;

      case rpc::Message::ABORT:
        handleAbort(reader.getAbort());
        break;

      case rpc::Message::BOOTSTRAP:
        handleBootstrap(kj::mv(message), reader.getBootstrap());
        break;

      case rpc::Message::CALL:
        handleCall(kj::mv(message), reader.getCall());
        break;

      case rpc::Message::RETURN:
        handleReturn(kj::mv(message), reader.getReturn());
        break;

      case rpc::Message::FINISH:
        handleFinish(reader.getFinish());
        break;

      case rpc::Message::RESOLVE:
        handleResolve(reader.getResolve());
        break;

      case rpc::Message::RELEASE:
        handleRelease(reader.getRelease());
        break;

      case rpc::Message::DISEMBARGO:
        handleDisembargo(reader.getDisembargo());
        break;

      default: {
        if (connection.is<Connected>()) {
          auto message = connection.get<Connected>()->newOutgoingMessage(
              firstSegmentSize(reader.totalSize(), messageSizeHint<void>()));
          message->getBody().initAs<rpc::Message>().setUnimplemented(reader);
          message->send();
        }
        break;
      }
    }
  }